

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageLoader::load_runtime_symtab_from_macr(CVmImageLoader *this,ulong siz)

{
  ushort uVar1;
  int iVar2;
  CVmRuntimeSymbols *pCVar3;
  undefined4 extraout_var;
  vm_runtime_sym *pvVar4;
  ulong uVar5;
  ulong uVar6;
  size_t arglen;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  char buf [10];
  char sym [80];
  undefined4 local_b4;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  ulong local_98;
  undefined8 local_90;
  char local_88 [88];
  
  if (this->runtime_macros_ == (CVmRuntimeSymbols *)0x0) {
    pCVar3 = (CVmRuntimeSymbols *)operator_new(0x18);
    pCVar3->head_ = (vm_runtime_sym *)0x0;
    pCVar3->tail_ = (vm_runtime_sym *)0x0;
    pCVar3->cnt_ = 0;
    this->runtime_macros_ = pCVar3;
  }
  if (siz < 4) {
LAB_00298612:
    err_throw(0x132);
  }
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_b4,4);
  uVar10 = (ulong)local_b4;
  if (uVar10 != 0) {
    uVar5 = siz - 4;
    do {
      if (uVar5 < 2) goto LAB_00298612;
      uVar5 = uVar5 - 2;
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_b4,2);
      uVar8 = (ulong)(ushort)local_b4;
      if (uVar8 < 0x51) {
        if (uVar5 < uVar8) goto LAB_00298612;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_88,uVar8);
      }
      else {
        if (uVar5 < uVar8) goto LAB_00298612;
        (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,uVar8);
      }
      if (uVar5 - uVar8 < 4) goto LAB_00298612;
      uVar6 = (uVar5 - uVar8) - 4;
      local_98 = uVar10;
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_b4,4);
      local_a8 = local_b4 & 0xffff;
      uVar1 = local_b4._2_2_;
      uVar7 = (uint)local_b4._2_2_;
      iVar2 = (*this->fp_->_vptr_CVmImageFile[8])();
      local_90 = CONCAT44(extraout_var,iVar2);
      local_a4 = (uint)uVar1;
      uVar10 = uVar6;
      if (uVar1 == 0) {
        arglen = 0;
      }
      else {
        arglen = 0;
        do {
          if (uVar10 < 2) goto LAB_00298612;
          uVar9 = uVar10 - 2;
          (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_b4,2);
          uVar5 = (ulong)(ushort)local_b4;
          uVar10 = uVar9 - uVar5;
          if (uVar9 < uVar5) goto LAB_00298612;
          arglen = arglen + uVar5 + 1;
          (*this->fp_->_vptr_CVmImageFile[9])();
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      if (uVar10 < 4) goto LAB_00298612;
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_b4,4);
      uVar7 = local_a4;
      local_a0 = (ulong)local_b4;
      pvVar4 = CVmRuntimeSymbols::add_macro
                         (this->runtime_macros_,local_88,uVar8,local_a0,local_a8,local_a4,arglen);
      (*this->fp_->_vptr_CVmImageFile[7])(this->fp_,local_90);
      if (uVar7 != 0) {
        uVar10 = 1;
        do {
          if (uVar6 < 2) goto LAB_00298612;
          uVar5 = uVar6 - 2;
          (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_b4,2);
          uVar8 = (ulong)(ushort)local_b4;
          uVar6 = uVar5 - uVar8;
          if (uVar5 < uVar8) goto LAB_00298612;
          (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,pvVar4->macro_args[uVar10 - 1],uVar8);
          pvVar4->macro_args[uVar10 - 1][uVar8] = '\0';
          if ((long)uVar10 < (long)pvVar4->macro_argc) {
            pvVar4->macro_args[uVar10] = pvVar4->macro_args[uVar10 - 1] + uVar8 + 1;
          }
          bVar11 = uVar10 != uVar7;
          uVar10 = uVar10 + 1;
        } while (bVar11);
      }
      if (uVar6 < 4) goto LAB_00298612;
      (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,4);
      uVar10 = local_98;
      uVar5 = (uVar6 - 4) - local_a0;
      if (uVar6 - 4 < local_a0) goto LAB_00298612;
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,pvVar4->macro_expansion);
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  return;
}

Assistant:

void CVmImageLoader::load_runtime_symtab_from_macr(VMG_ ulong siz)
{
    const size_t TOK_SYM_MAX_LEN = 80;
    char buf[10];
    char sym[TOK_SYM_MAX_LEN];
    ulong cnt;

    /* allocate the macro table if we haven't already done so */
    if (runtime_macros_ == 0)
        runtime_macros_ = new CVmRuntimeSymbols();

    /* read the symbol count */
    read_data(buf, 4, &siz);
    cnt = t3rp4u(buf);

    /* read the symbols and populate the symbol table */
    for ( ; cnt != 0 ; --cnt)
    {
        size_t sym_len;
        size_t exp_len;
        int argc;
        unsigned int flags;
        int i;

        /* read the symbol's length */
        read_data(buf, 2, &siz);
        sym_len = osrp2(buf);

        /* if it fits, read it */
        if (sym_len <= TOK_SYM_MAX_LEN)
        {
            /* read the name */
            read_data(sym, sym_len, &siz);
        }
        else
        {
            /* it's too long - skip it */
            skip_data(sym_len, &siz);
        }

        /* read the flags and argument count */
        read_data(buf, 4, &siz);
        flags = osrp2(buf);
        argc = osrp2(buf + 2);

        /* remember the current position */
        long start_pos = fp_->get_seek();
        ulong start_siz = siz;

        /* count up the argument sizes */
        size_t arg_len = 0;
        for (i = 0 ; i < argc ; ++i)
        {
            /* read this argument length */
            read_data(buf, 2, &siz);
            size_t l = osrp2(buf);

            /* add it to the total, plus a null byte */
            arg_len += l + 1;

            /* skip it in the file */
            skip_data(l, &siz);
        }

        /* read the expansion size */
        read_data(buf, 4, &siz);
        exp_len = osrp4(buf);

        /* allocate the symbol entry */
        vm_runtime_sym *entry = runtime_macros_->add_macro(
            sym, sym_len, exp_len, flags, argc, arg_len);

        /* seek back to the start of the argument list */
        fp_->seek(start_pos);
        siz = start_siz;

        /* read the arguments */
        for (i = 0 ; i < argc ; ++i)
        {
            /* read the argument length */
            read_data(buf, 2, &siz);
            size_t l = osrp2(buf);

            /* read this argument, and null-terminate it */
            read_data(entry->macro_args[i], l, &siz);
            entry->macro_args[i][l] = '\0';

            /* commit the storage */
            entry->commit_macro_arg(i, l + 1);
        }

        /* read the expansion */
        skip_data(4, &siz);
        read_data(entry->macro_expansion, exp_len, &siz);
    }
}